

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetRepaintManager::sync(QWidgetRepaintManager *this)

{
  QDebug QVar1;
  bool bVar2;
  char cVar3;
  QLoggingCategory *pQVar4;
  ulong uVar5;
  QPoint QVar6;
  QPlatformTextureList *widgetTextures;
  QRegion *in_RDX;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QPoint offset;
  QPoint local_98;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined4 local_84;
  char *local_80;
  QDebug local_78;
  QRegion local_70;
  QDebug local_68;
  QTextStream *local_60;
  undefined1 local_58 [8];
  QPoint local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar4->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_80 = pQVar4->name;
    local_98.xp.m_i = 2;
    local_98.yp.m_i = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_84 = 0;
    QMessageLogger::info();
    QVar1.stream = local_78.stream;
    QVar7.m_data = (storage_type *)0x7;
    QVar7.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
    if (local_50[0] != (QPoint)0x0) {
      LOCK();
      *(int *)local_50[0] = *(int *)local_50[0] + -1;
      UNLOCK();
      if (*(int *)local_50[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_78.stream,' ');
    }
    local_70.d = (QRegionData *)local_78.stream;
    *(int *)(local_78.stream + 0x28) = *(int *)(local_78.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_68,&local_70);
    QVar1.stream = local_68.stream;
    QVar8.m_data = (storage_type *)0x2;
    QVar8.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
    if (local_50[0] != (QPoint)0x0) {
      LOCK();
      *(int *)local_50[0] = *(int *)local_50[0] + -1;
      UNLOCK();
      if (*(int *)local_50[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    local_60 = (QTextStream *)local_68.stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    ::operator<<((Stream *)local_58,(QWidget *)&local_60);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug((QDebug *)&local_70);
    QDebug::~QDebug(&local_78);
  }
  if ((in_RSI != (QWidget *)0x0) && ((*(uint *)(*(long *)(*(long *)this + 0x20) + 8) & 0x8000) != 0)
     ) {
    bVar2 = hasPlatformWindow(in_RSI);
    if ((bVar2) && ((in_RSI->data->widget_attributes & 0x8c00) == 0x8800)) {
      cVar3 = QRegion::isEmpty();
      if (cVar3 == '\0') {
        if (*(long *)(this + 0x28) == 0) {
          cVar3 = QRegion::isEmpty();
          if ((cVar3 != '\0') && (*(long *)(this + 0x40) == 0)) {
            uVar5 = QBackingStore::size();
            if ((uVar5 & 0x8000000080000000) == 0) {
              widgetTextures = widgetTexturesFor(*(QWidget **)this,in_RSI);
              if (widgetTextures == (QPlatformTextureList *)0x0) {
                QRegion::QRegion((QRegion *)&local_98,in_RDX);
              }
              else {
                QRegion::QRegion((QRegion *)&local_98);
              }
              flush(this,in_RSI,(QRegion *)&local_98,widgetTextures);
              QRegion::~QRegion((QRegion *)&local_98);
              goto LAB_0031b8ee;
            }
          }
        }
        local_98.xp.m_i = -0x55555556;
        local_98.yp.m_i = -0x55555556;
        if (*(QWidget **)this == in_RSI) {
          local_98.xp.m_i = 0;
          local_98.yp.m_i = 0;
        }
        else {
          local_50[0].xp.m_i = 0;
          local_50[0].yp.m_i = 0;
          QVar6 = QWidget::mapTo(in_RSI,*(QWidget **)this,local_50);
          local_98.xp = QVar6.xp.m_i;
          local_98.yp = QVar6.yp.m_i;
        }
        markNeedsFlush(this,in_RSI,in_RDX,&local_98);
        bVar2 = syncAllowed(this);
        if (bVar2) {
          paintAndFlush(this);
        }
      }
    }
  }
LAB_0031b8ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::sync(QWidget *exposedWidget, const QRegion &exposedRegion)
{
    qCInfo(lcWidgetPainting) << "Syncing" << exposedRegion << "of" << exposedWidget;

    if (!tlw->isVisible())
        return;

    if (!exposedWidget || !hasPlatformWindow(exposedWidget)
        || !exposedWidget->isVisible() || !exposedWidget->testAttribute(Qt::WA_Mapped)
        || !exposedWidget->updatesEnabled() || exposedRegion.isEmpty()) {
        return;
    }

    // Nothing to repaint.
    if (!isDirty() && store->size().isValid()) {
        QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, exposedWidget);
        flush(exposedWidget, widgetTextures ? QRegion() : exposedRegion, widgetTextures);
        return;
    }

    // As requests to sync a specific widget typically comes from an expose event
    // we can't rely solely on our own dirty tracking to decide what to flush, and
    // need to respect the platform's request to at least flush the entire widget,
    QPoint offset = exposedWidget != tlw ? exposedWidget->mapTo(tlw, QPoint()) : QPoint();
    markNeedsFlush(exposedWidget, exposedRegion, offset);

    if (syncAllowed())
        paintAndFlush();
}